

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcShapeRepresentation::~IfcShapeRepresentation
          (IfcShapeRepresentation *this,void **vtt)

{
  void **vtt_local;
  IfcShapeRepresentation *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcShapeRepresentation,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcShapeRepresentation,_0UL> *)
             &(this->super_IfcShapeModel).super_IfcRepresentation.field_0x90,vtt + 10);
  IfcShapeModel::~IfcShapeModel(&this->super_IfcShapeModel,vtt + 1);
  return;
}

Assistant:

IfcShapeRepresentation() : Object("IfcShapeRepresentation") {}